

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

PatternSyntax * __thiscall slang::parsing::Parser::parsePattern(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  PatternSyntax *pPVar4;
  ParenthesizedPatternSyntax *pPVar5;
  ExpressionSyntax *expr;
  ExpressionPatternSyntax *pEVar6;
  SourceLocation SVar7;
  WildcardPatternSyntax *pWVar8;
  TaggedPatternSyntax *pTVar9;
  VariablePatternSyntax *pVVar10;
  OrderedStructurePatternMemberSyntax *pOVar11;
  StructurePatternMemberSyntax *pSVar12;
  undefined4 extraout_var;
  StructurePatternSyntax *pSVar13;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  Info *extraout_RDX_05;
  Info *extraout_RDX_06;
  Info *extraout_RDX_07;
  Info *extraout_RDX_08;
  TokenKind TVar14;
  Token openBrace;
  Token TVar15;
  Token TVar16;
  Token TVar17;
  Token closeBrace;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_110;
  Token local_100;
  Info *local_f0;
  undefined8 local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  ulong local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  TVar15 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar15.kind;
  if (Comma < TVar2) {
    if (TVar2 == Dot) {
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
      if (bVar1) {
        TVar16 = ParserBase::consume(&this->super_ParserBase);
        pWVar8 = syntax::SyntaxFactory::wildcardPattern(&this->factory,TVar15,TVar16);
        return &pWVar8->super_PatternSyntax;
      }
      TVar16 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pVVar10 = syntax::SyntaxFactory::variablePattern(&this->factory,TVar15,TVar16);
      return &pVVar10->super_PatternSyntax;
    }
    if (TVar2 == TaggedKeyword) {
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      TVar16 = ParserBase::expect(&this->super_ParserBase,Identifier);
      TVar17 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = syntax::SyntaxFacts::isPossiblePattern(TVar17.kind);
      if (bVar1) {
        pPVar4 = parsePattern(this);
      }
      else {
        pPVar4 = (PatternSyntax *)0x0;
      }
      pTVar9 = syntax::SyntaxFactory::taggedPattern(&this->factory,TVar15,TVar16,pPVar4);
      return &pTVar9->super_PatternSyntax;
    }
LAB_001d4205:
    expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x1,0);
    pEVar6 = syntax::SyntaxFactory::expressionPattern(&this->factory,expr);
    return &pEVar6->super_PatternSyntax;
  }
  if (TVar2 != ApostropheOpenBrace) {
    if (TVar2 == OpenParenthesis) {
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      pPVar4 = parsePattern(this);
      TVar16 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pPVar5 = syntax::SyntaxFactory::parenthesizedPattern(&this->factory,TVar15,pPVar4,TVar16);
      return &pPVar5->super_PatternSyntax;
    }
    goto LAB_001d4205;
  }
  TVar15 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar15.info;
  local_e8 = TVar15._0_8_;
  Token::Token(&local_100);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if (bVar1) {
    TVar15 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar15.kind != Colon) goto LAB_001d434c;
    local_110 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isCloseBrace(local_110.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar7 = Token::location(&local_110);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4c0005,SVar7);
      }
      local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(local_110.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_110,CloseBrace,&local_100,(DiagCode)0x4c0005);
        src = extraout_RDX_08;
        goto LAB_001d4737;
      }
      do {
        pSVar12 = parseMemberPattern(this);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar12;
        local_d0 = CONCAT71(local_d0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar15.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        iVar3 = 3;
        src = extraout_RDX_04;
        if (TVar14 != EndOfFile && !bVar1) {
          if (TVar14 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                (&this->super_ParserBase,(DiagCode)0x4c0005,false);
              if (!bVar1) {
                local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
                src = local_100.info;
                iVar3 = 1;
                goto LAB_001d46f4;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_d0 = local_d0 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_e0._M_first);
          TVar15 = ParserBase::peek(&this->super_ParserBase);
          TVar14 = TVar15.kind;
          bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
          if (TVar14 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_06;
          }
          else {
            src = extraout_RDX_05;
            if ((local_110.kind == TVar14) && (local_110.info == TVar15.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                (&this->super_ParserBase,(DiagCode)0x4c0005,true);
              src = extraout_RDX_07;
              if (!bVar1) goto LAB_001d46f4;
            }
            iVar3 = 0;
            local_110 = TVar15;
          }
        }
LAB_001d46f4:
      } while (iVar3 == 0);
      if (iVar3 != 3) goto LAB_001d4737;
      local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
  else {
LAB_001d434c:
    local_110 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isCloseBrace(local_110.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar7 = Token::location(&local_110);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4c0005,SVar7);
      }
      local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = syntax::SyntaxFacts::isPossiblePatternOrComma(local_110.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_110,CloseBrace,&local_100,(DiagCode)0x4c0005);
        src = extraout_RDX_03;
        goto LAB_001d4737;
      }
      do {
        pPVar4 = parsePattern(this);
        pOVar11 = syntax::SyntaxFactory::orderedStructurePatternMember(&this->factory,pPVar4);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pOVar11;
        local_d0 = CONCAT71(local_d0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar15.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        iVar3 = 3;
        src = extraout_RDX;
        if (TVar14 != EndOfFile && !bVar1) {
          if (TVar14 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                (&this->super_ParserBase,(DiagCode)0x4c0005,false);
              if (!bVar1) {
                local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
                src = local_100.info;
                iVar3 = 1;
                goto LAB_001d4565;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_d0 = local_d0 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_e0._M_first);
          TVar15 = ParserBase::peek(&this->super_ParserBase);
          TVar14 = TVar15.kind;
          bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
          if (TVar14 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if ((local_110.kind == TVar14) && (local_110.info == TVar15.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                (&this->super_ParserBase,(DiagCode)0x4c0005,true);
              src = extraout_RDX_02;
              if (!bVar1) goto LAB_001d4565;
            }
            iVar3 = 0;
            local_110 = TVar15;
          }
        }
LAB_001d4565:
      } while (iVar3 == 0);
      if (iVar3 != 3) goto LAB_001d4737;
      local_100 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
  src = local_100.info;
LAB_001d4737:
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = CONCAT44(extraout_var,iVar3);
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f9cf8;
  openBrace.info = local_f0;
  openBrace.kind = (undefined2)local_e8;
  openBrace._2_1_ = local_e8._2_1_;
  openBrace.numFlags.raw = local_e8._3_1_;
  openBrace.rawLen = local_e8._4_4_;
  pSVar13 = syntax::SyntaxFactory::structurePattern
                      (&this->factory,openBrace,
                       (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                       &local_e0._M_first,local_100);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return &pSVar13->super_PatternSyntax;
}

Assistant:

PatternSyntax& Parser::parsePattern() {
    switch (peek().kind) {
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& pattern = parsePattern();
            return factory.parenthesizedPattern(openParen, pattern,
                                                expect(TokenKind::CloseParenthesis));
        }
        case TokenKind::Dot: {
            auto dot = consume();
            if (peek(TokenKind::Star))
                return factory.wildcardPattern(dot, consume());
            return factory.variablePattern(dot, expect(TokenKind::Identifier));
        }
        case TokenKind::TaggedKeyword: {
            auto tagged = consume();
            auto name = expect(TokenKind::Identifier);

            PatternSyntax* pattern = nullptr;
            if (isPossiblePattern(peek().kind))
                pattern = &parsePattern();

            return factory.taggedPattern(tagged, name, pattern);
        }
        case TokenKind::ApostropheOpenBrace: {
            auto openBrace = consume();
            Token closeBrace;
            SmallVector<TokenOrSyntax, 4> buffer;

            if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Colon) {
                parseList<isIdentifierOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() { return &parseMemberPattern(); });
            }
            else {
                parseList<isPossiblePatternOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() {
                        auto& pattern = parsePattern();
                        return &factory.orderedStructurePatternMember(pattern);
                    });
            }

            return factory.structurePattern(openBrace, buffer.copy(alloc), closeBrace);
        }
        default:
            break;
    }

    // otherwise, it's either an expression or an error (parseExpression will handle that for us)
    return factory.expressionPattern(parseSubExpression(ExpressionOptions::PatternContext, 0));
}